

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_stream.hpp
# Opt level: O3

basic_binary_istream<fail_flag_serialization_policy> *
detail::operator>>(istream_mixin<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
                   *stream,family *value)

{
  byte *pbVar1;
  pair<person,_person> *v1;
  span<const_std::byte> buffer;
  pair<unsigned_long,_bool> pVar2;
  basic_binary_istream<fail_flag_serialization_policy> *local_20;
  
  if ((stream->
      super_stream_mixin_base<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
      ).super_fail_flag_serialization_policy.overflow == false) {
    pbVar1 = *(byte **)(stream + -0x10);
    if (*(long *)(stream + -8) - (long)pbVar1 < 0) {
      __assert_fail("diff >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/src/include/span.hpp"
                    ,0x22,"size_t span<const std::byte>::size() const [T = const std::byte]");
    }
    buffer.end_ = pbVar1 + (*(long *)(stream + -8) - (long)pbVar1);
    buffer.begin_ = pbVar1;
    pVar2 = try_get_deserialized_size<family>(buffer);
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      (stream->
      super_stream_mixin_base<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
      ).super_fail_flag_serialization_policy.overflow = true;
    }
    else {
      local_20 = (basic_binary_istream<fail_flag_serialization_policy> *)(stream + -0x10);
      std::
      __invoke_impl<void,detail::do_deserialize<std::tuple<std::pair<person,person>&,std::vector<person,std::allocator<person>>&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>&>>(std::tuple<std::pair<person,person>&,std::vector<person,std::allocator<person>>&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>&>&,span<std::byte_const>&,value_tag<(serialization_category)6>)::_lambda((auto:1&)___)_1_,std::pair<person,person>&,std::vector<person,std::allocator<person>>&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>&>
                (&local_20,value,&value->childs,&value->addresses);
    }
  }
  return (basic_binary_istream<fail_flag_serialization_policy> *)(stream + -0x10);
}

Assistant:

StreamDerived& operator>>(istream_mixin<StreamDerived, SpanBase, fail_flag_serialization_policy>& stream, T& value) {
        if (stream.overflow) return stream.base();

        auto const [_, success] = try_get_deserialized_size<T>(stream.span());
        if (!success) {
            stream.overflow = true;
            return stream.base();
        }
        deserialize(value, stream.span());
        return stream.base();
    }